

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

string * __thiscall
cnn::ConstScalarMultiply::as_string
          (string *__return_storage_ptr__,ConstScalarMultiply *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  pointer pbVar1;
  ostream *poVar2;
  ostringstream s;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  pbVar1 = (arg_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)aoStack_198,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," * ",3);
  std::ostream::_M_insert<double>((double)this->alpha);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string ConstScalarMultiply::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << arg_names[0] << " * " << alpha;
  return s.str();
}